

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

ActionHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateActionHistoryTree(PlanningUnitMADPDiscrete *this,Index agentI)

{
  TreeNode<ActionHistory> *this_00;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined4 extraout_var;
  ActionHistoryTree *pAVar4;
  size_type sVar5;
  reference ppTVar6;
  ActionHistory *this_01;
  size_t sVar7;
  reference pvVar8;
  reference pvVar9;
  ostream *poVar10;
  void *this_02;
  reference pvVar11;
  size_type sVar12;
  uint in_ESI;
  PlanningUnit *in_RDI;
  TreeNode<ActionHistory> *in_stack_00000010;
  LIndex in_stack_00000018;
  TreeNode<ActionHistory> *in_stack_00000020;
  size_t length;
  size_t nrActionHist;
  Index nr_AHI_for_ts;
  Index obsI;
  Index nr_AHI_for_ts_1;
  int thisLength;
  ActionHistoryTree *oht;
  Index ts;
  ActionHistoryTree *root;
  ActionHistory *oh;
  ActionHistoryTree *next_oht;
  ActionHistory *next_oh;
  size_t nrO;
  int maxLength;
  Index ActionHistoryIndex;
  queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
  ohtQueue;
  ActionHistory *in_stack_fffffffffffffe08;
  TreeNode<ActionHistory> *in_stack_fffffffffffffe10;
  value_type *in_stack_fffffffffffffe18;
  ActionHistory *in_stack_fffffffffffffe20;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe28;
  ActionHistory *in_stack_fffffffffffffe30;
  uint local_d4;
  uint local_a4;
  uint local_64;
  
  std::
  queue<TreeNode<ActionHistory>*,std::deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>>
  ::queue<std::deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>,void>
            ((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
              *)in_stack_fffffffffffffe10);
  local_64 = 0;
  sVar3 = PlanningUnit::GetHorizon(in_RDI);
  iVar1 = (*in_RDI->_vptr_PlanningUnit[7])(in_RDI,(ulong)in_ESI);
  operator_new(0x30);
  ActionHistory::ActionHistory
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (Index)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  pAVar4 = (ActionHistoryTree *)operator_new(0x58);
  TreeNode<ActionHistory>::TreeNode(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::
  queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
  ::push((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
          *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  local_a4 = 0;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *)(in_RDI + 7),(ulong)in_ESI);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_fffffffffffffe10,(value_type_conflict2 *)in_stack_fffffffffffffe08);
  while (sVar5 = std::
                 queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
                 ::size((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
                         *)0x9d453c), sVar5 != 0) {
    ppTVar6 = std::
              queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
              ::front((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
                       *)0x9d4565);
    this_00 = *ppTVar6;
    TreeNode<ActionHistory>::SetIndex(this_00,(ulong)local_64);
    std::
    vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
    ::operator[]((vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                  *)(in_RDI + 0xe),(ulong)in_ESI);
    std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::push_back
              ((vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *)
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    this_01 = TreeNode<ActionHistory>::GetContainedElement(this_00);
    sVar7 = History::GetLength((History *)this_01);
    uVar2 = (uint)sVar7;
    if (local_a4 != uVar2) {
      pvVar8 = std::
               vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                             *)(in_RDI + 7),(ulong)in_ESI);
      pvVar9 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (pvVar8,(ulong)local_a4);
      Globals::CastLIndexToIndex(*pvVar9);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&in_RDI[5]._m_seed,(ulong)in_ESI);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10,
                 (value_type_conflict2 *)in_stack_fffffffffffffe08);
      local_a4 = local_a4 + 1;
      if (local_a4 != uVar2) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"ERROR: CreateActionHistories:  ++ts != ");
        poVar10 = std::operator<<(poVar10,"(Index) thisLength !!! ts (now) is: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_a4);
        poVar10 = std::operator<<(poVar10,"thisLength  =");
        this_02 = (void *)std::ostream::operator<<(poVar10,uVar2);
        std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                    *)(in_RDI + 7),(ulong)in_ESI);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 in_stack_fffffffffffffe10,(value_type_conflict2 *)in_stack_fffffffffffffe08);
    }
    local_64 = local_64 + 1;
    if ((int)uVar2 < (int)sVar3 + -1) {
      for (local_d4 = 0; (ulong)local_d4 < CONCAT44(extraout_var,iVar1); local_d4 = local_d4 + 1) {
        operator_new(0x30);
        TreeNode<ActionHistory>::GetContainedElement(this_00);
        ActionHistory::ActionHistory
                  (in_stack_fffffffffffffe30,(Index)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   in_stack_fffffffffffffe20);
        operator_new(0x58);
        TreeNode<ActionHistory>::TreeNode(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        TreeNode<ActionHistory>::SetSuccessor(in_stack_00000020,in_stack_00000018,in_stack_00000010)
        ;
        std::
        queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
        ::push((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
                *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
      }
    }
    std::
    queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
    ::pop((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
           *)0x9d49b9);
  }
  pvVar8 = std::
           vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ::operator[]((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                         *)(in_RDI + 7),(ulong)in_ESI);
  pvVar9 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (pvVar8,(ulong)local_a4);
  Globals::CastLIndexToIndex(*pvVar9);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&in_RDI[5]._m_seed,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10,
             (value_type_conflict2 *)in_stack_fffffffffffffe08);
  PlanningUnit::GetHorizon(in_RDI);
  sVar3 = IndexTools::CalculateNumberOfSequences
                    ((size_t)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
  if (local_64 == sVar3) {
    pvVar11 = std::
              vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
              ::operator[]((vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                            *)(in_RDI + 0xe),(ulong)in_ESI);
    sVar12 = std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::
             size(pvVar11);
    if (sVar3 == sVar12) goto LAB_009d4bf0;
  }
  poVar10 = std::operator<<((ostream *)&std::cerr," WARNING:ActionHistoryIndex=");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_64);
  poVar10 = std::operator<<(poVar10," nrActionHistories=");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar3);
  poVar10 = std::operator<<(poVar10," _m_actionHistoryTreeVectors[agentI=");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,in_ESI);
  poVar10 = std::operator<<(poVar10,"].size()=");
  pvVar11 = std::
            vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
            ::operator[]((vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                          *)(in_RDI + 0xe),(ulong)in_ESI);
  sVar12 = std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::size
                     (pvVar11);
  in_stack_fffffffffffffe10 = (TreeNode<ActionHistory> *)std::ostream::operator<<(poVar10,sVar12);
  std::ostream::operator<<(in_stack_fffffffffffffe10,std::endl<char,std::char_traits<char>>);
LAB_009d4bf0:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10,
             (value_type_conflict2 *)in_stack_fffffffffffffe08);
  std::
  queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
  ::~queue((queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
            *)0x9d4c36);
  return pAVar4;
}

Assistant:

ActionHistoryTree* PlanningUnitMADPDiscrete::CreateActionHistoryTree(Index agentI)
{
    //we want to number the Action Histories breadth-first, so we 
    //use a queue:
    queue<ActionHistoryTree*> ohtQueue;
    
    Index ActionHistoryIndex = 0;
    int maxLength = GetHorizon() - 1;//max. action hist length = h - 1
    size_t nrO = GetNrActions(agentI);
    ActionHistory* next_oh = 0;
    ActionHistoryTree* next_oht = 0;
    
    // return a new initial (=empty) action history

    //action history never has an initial action
    //if(!GetMADPDI()->IsInitialActionEmpty())
    //    throw E("this MADP issues a non-empty initial action, but this is not yet supported by PlanningUnitMADPDiscrete::CreateActionHistoryTree");

    ActionHistory* oh = new ActionHistory(*this, agentI);
    ActionHistoryTree* root = new ActionHistoryTree(oh);//, nrO);
    ohtQueue.push(root);
    Index ts = 0;
    _m_firstAHIforT[agentI].push_back(ActionHistoryIndex);
    while(ohtQueue.size() > 0)
    {
        ActionHistoryTree* oht = ohtQueue.front();
        oht->SetIndex(ActionHistoryIndex);
        _m_actionHistoryTreeVectors[agentI].push_back(oht);
        int thisLength = oht->GetContainedElement()->GetLength(); 
        if(ts != (Index) thisLength ) //length 0 <-> ts 0 
        {
            // we've now started processing AHs for the next ts
            Index nr_AHI_for_ts = ActionHistoryIndex - 
                CastLIndexToIndex(_m_firstAHIforT[agentI][ts]);
#if DEBUG_PUDCAHT
            cout << "First ah for next ts+1: store nr of ts-AH..."<<endl<<
                "_m_firstAHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstAHIforT[agentI][ts] << ", current AHI = " <<
                ActionHistoryIndex << endl;
            Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif                
            _m_nrActionHistoriesT[agentI].push_back(nr_AHI_for_ts); 
#if DEBUG_PUDCAHT
            cout << "Set  _m_nrActionHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_AHI_for_ts <<endl;
#endif
            if(++ts != (Index) thisLength)
                cerr << "ERROR: CreateActionHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength  =" << thisLength <<endl;            
            _m_firstAHIforT[agentI].push_back(ActionHistoryIndex);            
        }
        
        ActionHistoryIndex++; //index of an Action HISTORY
        
        if(thisLength < maxLength)
            for(Index obsI = 0; obsI < nrO; obsI++) //obsI = action index
            {
                next_oh = new ActionHistory(obsI, 
                    oht->GetActionHistory());
                next_oht = new ActionHistoryTree(next_oh);//, nrO);
                oht->SetSuccessor(obsI, next_oht);
                ohtQueue.push(next_oht);
            }
        ohtQueue.pop();
    }    
    //there is no next time step, so _m_nrObservationHistoriesT[agentI][lastTs]
    //have not been stored yet: do this now
    Index nr_AHI_for_ts = ActionHistoryIndex
        - CastLIndexToIndex(_m_firstAHIforT[agentI][ts]);
#if DEBUG_PUDCAHT
    cout << "Last ts end: store nr of ts=h-1 AH..."<<endl<<
        "_m_firstAHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
        _m_firstAHIforT[agentI][ts] << ", current AHI = " <<
        ActionHistoryIndex << endl;
    Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif
    _m_nrActionHistoriesT[agentI].push_back(nr_AHI_for_ts);
#if DEBUG_PUDCAHT
    cout << "Set  _m_nrActionHistoriesT[agentI="<<agentI<<"][t="<<tempIndex
         <<" (last time step ts="<<ts<<")] = "<< nr_AHI_for_ts<<endl;
#endif

    //in a horizon h MADP without initial observation, the max. action
    //sequence length is h-1 actions (and the minimum is 0).
    //(after h actions the problem is ended already - length-h action sequences
    //are not considered.)
    size_t nrActionHist;
    size_t length = GetHorizon() - 1; // = maxLength 
    nrActionHist = IndexTools::CalculateNumberOfSequences(nrO, length);
    
    if( ActionHistoryIndex != nrActionHist || 
        nrActionHist != _m_actionHistoryTreeVectors[agentI].size() )
        cerr << " WARNING:ActionHistoryIndex="<< ActionHistoryIndex <<
        " nrActionHistories=" << nrActionHist << 
        " _m_actionHistoryTreeVectors[agentI="<<agentI<<"].size()="<<
        _m_actionHistoryTreeVectors[agentI].size() << endl;
    
    _m_nrActionHistories.push_back(ActionHistoryIndex);
    
    return(root);
}